

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O1

double r8_gamma(double x)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  if (x <= 0.0) {
    dVar4 = (double)(int)-x;
    dVar8 = -x - dVar4;
    if ((dVar8 != 0.0) || (NAN(dVar8))) {
      bVar1 = (double)(int)(dVar4 * 0.5) + (double)(int)(dVar4 * 0.5) != dVar4;
      dVar8 = sin(dVar8 * 3.141592653589793);
      dVar8 = -3.141592653589793 / dVar8;
      x = 1.0 - x;
      goto LAB_001ca93d;
    }
LAB_001ca9a0:
    dVar8 = 1.79e+308;
  }
  else {
    dVar8 = 1.0;
    bVar1 = false;
LAB_001ca93d:
    if (2.22e-16 <= x) {
      if (12.0 <= x) {
        if (171.624 < x) goto LAB_001ca9a0;
        dVar4 = 0.0057083835261;
        lVar3 = 0;
        do {
          dVar4 = dVar4 / (x * x) + *(double *)((long)&DAT_00226da0 + lVar3);
          lVar3 = lVar3 + 8;
        } while (lVar3 != 0x30);
        dVar7 = log(x);
        dVar4 = exp(dVar7 * (x + -0.5) + (dVar4 / x - x) + 0.9189385332046728);
      }
      else {
        dVar4 = 1.0;
        if (1.0 <= x) {
          iVar2 = (int)x + -1;
          dVar6 = x - (double)iVar2;
          dVar7 = dVar6 + -1.0;
        }
        else {
          dVar6 = x + 1.0;
          iVar2 = 0;
          dVar7 = x;
        }
        dVar5 = 0.0;
        lVar3 = 0;
        do {
          dVar5 = (dVar5 + *(double *)((long)&DAT_00226de0 + lVar3)) * dVar7;
          dVar4 = dVar4 * dVar7 + *(double *)((long)&DAT_00226e20 + lVar3);
          lVar3 = lVar3 + 8;
        } while (lVar3 != 0x40);
        dVar4 = dVar5 / dVar4 + 1.0;
        if (x < dVar6) goto LAB_001caa10;
        if (0 < iVar2 && dVar6 < x) {
          do {
            dVar4 = dVar4 * dVar6;
            dVar6 = dVar6 + 1.0;
            iVar2 = iVar2 + -1;
          } while (iVar2 != 0);
        }
      }
    }
    else {
      if (x < 2.23e-308) goto LAB_001ca9a0;
      dVar4 = 1.0;
LAB_001caa10:
      dVar4 = dVar4 / x;
    }
    if (bVar1) {
      dVar4 = -dVar4;
    }
    dVar8 = (double)(-(ulong)(dVar8 != 1.0) & (ulong)(dVar8 / dVar4) |
                    ~-(ulong)(dVar8 != 1.0) & (ulong)dVar4);
  }
  return dVar8;
}

Assistant:

double r8_gamma ( double x )

//****************************************************************************80
//
//  Purpose:
//
//    R8_GAMMA evaluates Gamma(X) for a real argument.
//
//  Discussion:
//
//    This routine calculates the gamma function for a real argument X.
//
//    Computation is based on an algorithm outlined in reference 1.
//    The program uses rational functions that approximate the gamma
//    function to at least 20 significant decimal digits.  Coefficients
//    for the approximation over the interval (1,2) are unpublished.
//    Those for the approximation for 12 <= X are from reference 2.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    18 January 2008
//
//  Author:
//
//    Original FORTRAN77 version by William Cody, Laura Stoltz.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    William Cody,
//    An Overview of Software Development for Special Functions,
//    in Numerical Analysis Dundee, 1975,
//    edited by GA Watson,
//    Lecture Notes in Mathematics 506,
//    Springer, 1976.
//
//    John Hart, Ward Cheney, Charles Lawson, Hans Maehly,
//    Charles Mesztenyi, John Rice, Henry Thatcher,
//    Christoph Witzgall,
//    Computer Approximations,
//    Wiley, 1968,
//    LC: QA297.C64.
//
//  Parameters:
//
//    Input, double X, the argument of the function.
//
//    Output, double R8_GAMMA, the value of the function.
//
{
//
//  Coefficients for minimax approximation over (12, INF).
//
  double c[7] = {
   -1.910444077728E-03, 
    8.4171387781295E-04, 
   -5.952379913043012E-04, 
    7.93650793500350248E-04, 
   -2.777777777777681622553E-03, 
    8.333333333333333331554247E-02, 
    5.7083835261E-03 };
  double eps = 2.22E-16;
  double fact;
  double half = 0.5;
  int i;
  int n;
  double one = 1.0;
  double p[8] = {
  -1.71618513886549492533811E+00,
   2.47656508055759199108314E+01, 
  -3.79804256470945635097577E+02,
   6.29331155312818442661052E+02, 
   8.66966202790413211295064E+02,
  -3.14512729688483675254357E+04, 
  -3.61444134186911729807069E+04,
   6.64561438202405440627855E+04 };
  bool parity;
  double q[8] = {
  -3.08402300119738975254353E+01,
   3.15350626979604161529144E+02, 
  -1.01515636749021914166146E+03,
  -3.10777167157231109440444E+03, 
   2.25381184209801510330112E+04,
   4.75584627752788110767815E+03, 
  -1.34659959864969306392456E+05,
  -1.15132259675553483497211E+05 };
  const double r8_pi = 3.1415926535897932384626434;
  double res;
  double sqrtpi = 0.9189385332046727417803297;
  double sum;
  double twelve = 12.0;
  double two = 2.0;
  double value;
  double xbig = 171.624;
  double xden;
  double xinf = 1.79E+308;
  double xminin = 2.23E-308;
  double xnum;
  double y;
  double y1;
  double ysq;
  double z;
  double zero = 0.0;;

  parity = false;
  fact = one;
  n = 0;
  y = x;
//
//  Argument is negative.
//
  if ( y <= zero )
  {
    y = - x;
    y1 = double(int( y ));
    res = y - y1;

    if ( res != zero )
    {
      if ( y1 != double(int( y1 * half ) * two ))
      {
        parity = true;
      }

      fact = - r8_pi / sin ( r8_pi * res );
      y = y + one;
    }
    else
    {
      res = xinf;
      value = res;
      return value;
    }
  }
//
//  Argument is positive.
//
  if ( y < eps )
  {
//
//  Argument < EPS.
//
    if ( xminin <= y )
    {
      res = one / y;
    }
    else
    {
      res = xinf;
      value = res;
      return value;
    }
  }
  else if ( y < twelve )
  {
    y1 = y;
//
//  0.0 < argument < 1.0.
//
    if ( y < one )
    {
      z = y;
      y = y + one;
    }
//
//  1.0 < argument < 12.0.
//  Reduce argument if necessary.
//
    else
    {
      n = int( y ) - 1;
      y = y - double( n );
      z = y - one;
    }
//
//  Evaluate approximation for 1.0 < argument < 2.0.
//
    xnum = zero;
    xden = one;
    for ( i = 0; i < 8; i++ )
    {
      xnum = ( xnum + p[i] ) * z;
      xden = xden * z + q[i];
    }
    res = xnum / xden + one;
//
//  Adjust result for case  0.0 < argument < 1.0.
//
    if ( y1 < y )
    {
      res = res / y1;
    }
//
//  Adjust result for case 2.0 < argument < 12.0.
//
    else if ( y < y1 )
    {
      for ( i = 1; i <= n; i++ )
      {
        res = res * y;
        y = y + one;
      }
    }
  }
  else
  {
//
//  Evaluate for 12.0 <= argument.
//
    if ( y <= xbig )
    {
      ysq = y * y;
      sum = c[6];
      for ( i = 0; i < 6; i++ )
      {
        sum = sum / ysq + c[i];
      }
      sum = sum / y - y + sqrtpi;
      sum = sum + ( y - half ) * log ( y );
      res = exp ( sum );
    }
    else
    {
      res = xinf;
      value = res;
      return value;
    }
  }
//
//  Final adjustments and return.
//
  if ( parity )
  {
    res = - res;
  }

  if ( fact != one )
  {
    res = fact / res;
  }

  value = res;

  return value;
}